

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.hh
# Opt level: O3

void phosg::expect_raises_fn<std::out_of_range>(char *file,uint64_t line,function<void_()> *fn)

{
  long *plVar1;
  undefined8 uVar2;
  int extraout_EDX;
  string msg;
  string local_38;
  
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*fn->_M_invoker)((_Any_data *)fn);
    expect_generic(false,"expected exception, but none raised",file,line);
    return;
  }
  ::std::__throw_bad_function_call();
  if (extraout_EDX == 3) {
    __cxa_begin_catch();
  }
  else {
    plVar1 = (long *)__cxa_begin_catch();
    if (extraout_EDX == 2) {
      uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
      string_printf_abi_cxx11_(&local_38,"incorrect exception type raised (what: %s)",uVar2);
      expect_generic(false,local_38._M_dataplus._M_p,file,line);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      __cxa_end_catch();
      return;
    }
    expect_generic(false,"incorrect exception type raised",file,line);
  }
  __cxa_end_catch();
  return;
}

Assistant:

void expect_raises_fn(const char* file, uint64_t line, std::function<void()> fn) {
  try {
    fn();
    expect_generic(false, "expected exception, but none raised", file, line);
  } catch (const ExcT&) {
    return;
  } catch (const std::exception& e) {
    std::string msg = string_printf("incorrect exception type raised (what: %s)", e.what());
    expect_generic(false, msg.c_str(), file, line);
  } catch (...) {
    // TODO: It'd be nice to show SOMETHING about the thrown exception here,
    // but it's probably pretty rare to catch something that isn't a
    // std::exception anyway.
    expect_generic(false, "incorrect exception type raised", file, line);
  }
}